

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O0

JSONElement * __thiscall JSONParser::parse(JSONElement *__return_storage_ptr__,JSONParser *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  jsmntok_t *pjVar6;
  int toksize;
  JSONParser *this_local;
  
  jsmn_init(&this->m_parser);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
  iVar2 = jsmn_parse(&this->m_parser,pvVar3,sVar4 - 1,(jsmntok_t *)0x0,0);
  if (iVar2 < 0) {
    JSONElement::JSONElement(__return_storage_ptr__,(jsmntok_t *)0x0,0,(char *)0x0);
  }
  else {
    if (this->m_tokens != (jsmntok_t *)0x0) {
      operator_delete__(this->m_tokens);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pjVar6 = (jsmntok_t *)operator_new__(uVar5);
    this->m_tokens = pjVar6;
    this->m_toksize = iVar2;
    jsmn_init(&this->m_parser);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
    jsmn_parse(&this->m_parser,pvVar3,sVar4 - 1,this->m_tokens,this->m_toksize);
    pjVar6 = this->m_tokens;
    iVar2 = this->m_toksize;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,0);
    JSONElement::JSONElement(__return_storage_ptr__,pjVar6,(long)iVar2,pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONElement JSONParser::parse()
{
    // First run to count tokens
    jsmn_init(&m_parser);
    int toksize = jsmn_parse(&m_parser, &m_buffer[0],
            m_buffer.size() - 1, NULL, 0);
    if (toksize < 0) {
        return JSONElement(NULL, 0, NULL);
    }
    delete[] m_tokens;
    m_tokens = new jsmntok_t[toksize];
    m_toksize = toksize;
    // Parse tokens
    jsmn_init(&m_parser); // must re-initialize
    jsmn_parse(&m_parser, &m_buffer[0],
            m_buffer.size() - 1, m_tokens, m_toksize);
    return JSONElement(m_tokens, m_toksize, &m_buffer[0]);
}